

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O1

MPP_RET idr_memory_management(H264_DpbBuf_t *p_Dpb,H264_StorePic_t *p)

{
  uint uVar1;
  h264_dec_ctx_t *phVar2;
  h264_frame_store_t **pphVar3;
  MPP_RET MVar4;
  ulong uVar5;
  H264_StorePic_t *pHVar6;
  
  phVar2 = p_Dpb->p_Vid->p_Dec;
  pHVar6 = p;
  if ((p->no_output_of_prior_pics_flag != 0) && (uVar1 = p_Dpb->used_size, (ulong)uVar1 != 0)) {
    pphVar3 = p_Dpb->fs;
    uVar5 = 0;
    do {
      pHVar6 = (H264_StorePic_t *)pphVar3[uVar5];
      pHVar6->long_term_pic_num = 1;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  MVar4 = flush_dpb(p_Dpb,(RK_S32)pHVar6);
  if (MVar4 < MPP_OK) {
    if (((byte)h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x683);
    }
    if (p_Dpb->used_size != 0) {
      uVar5 = 0;
      do {
        free_frame_store(p_Dpb->p_Vid->p_Dec,p_Dpb->fs[uVar5]);
        uVar5 = uVar5 + 1;
      } while (uVar5 < p_Dpb->used_size);
    }
  }
  else {
    p_Dpb->last_picture = (h264_frame_store_t *)0x0;
    update_ref_list(p_Dpb);
    update_ltref_list(p_Dpb);
    p_Dpb->last_output_poc = -0x80000000;
    (phVar2->errctx).i_slice_no = 1;
    if (p->long_term_reference_flag == 0) {
      p_Dpb->max_long_term_pic_idx = -1;
      p->is_long_term = '\0';
    }
    else {
      p_Dpb->max_long_term_pic_idx = 0;
      p->is_long_term = '\x01';
      p->long_term_frame_idx = 0;
    }
    p_Dpb->last_output_view_id = -1;
    MVar4 = MPP_OK;
  }
  return MVar4;
}

Assistant:

MPP_RET idr_memory_management(H264_DpbBuf_t *p_Dpb, H264_StorePic_t *p)
{
    RK_U32 i = 0;
    RK_S32 type = -1;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dErrCtx_t *p_err = &p_Dpb->p_Vid->p_Dec->errctx;

    if (p->no_output_of_prior_pics_flag) {
        //!< free all stored pictures
        for (i = 0; i < p_Dpb->used_size; i++) {
            //!< reset all reference settings
            //Set is_output flag to true to avoid real output this frame to
            //display queue. These frames will be mark as unused and remove from
            //dpb at flush_dpb
            p_Dpb->fs[i]->is_output = 1;
        }
    }

    type = (p->layer_id == 0) ? 1 : 2;
    FUN_CHECK(ret = flush_dpb(p_Dpb, type));

    p_Dpb->last_picture = NULL;

    update_ref_list(p_Dpb);
    update_ltref_list(p_Dpb);
    p_Dpb->last_output_poc = INT_MIN;
    p_err->i_slice_no = 1;

    if (p->long_term_reference_flag) {
        p_Dpb->max_long_term_pic_idx = 0;
        p->is_long_term = 1;
        p->long_term_frame_idx = 0;
    } else {
        p_Dpb->max_long_term_pic_idx = -1;
        p->is_long_term = 0;
    }
    p_Dpb->last_output_view_id = -1;

    return ret = MPP_OK;

__FAILED:
    for (i = 0; i < p_Dpb->used_size; i++) { // when error and free malloc buf
        free_frame_store(p_Dpb->p_Vid->p_Dec, p_Dpb->fs[i]);
    }
    return ret;
}